

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::SPIRBlock::Phi,_8UL>::operator=
          (SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> *this,
          SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> *other)

{
  BlockID BVar1;
  Phi *pPVar2;
  Phi *pPVar3;
  ulong local_28;
  size_t i;
  SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> *other_local;
  SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> *this_local;
  
  if (this != other) {
    clear(this);
    reserve(this,(other->super_VectorView<spirv_cross::SPIRBlock::Phi>).buffer_size);
    for (local_28 = 0; local_28 < (other->super_VectorView<spirv_cross::SPIRBlock::Phi>).buffer_size
        ; local_28 = local_28 + 1) {
      pPVar2 = (this->super_VectorView<spirv_cross::SPIRBlock::Phi>).ptr + local_28;
      pPVar3 = (other->super_VectorView<spirv_cross::SPIRBlock::Phi>).ptr + local_28;
      BVar1.id = (pPVar3->parent).id;
      pPVar2->local_variable = (ID)(pPVar3->local_variable).id;
      pPVar2->parent = (BlockID)BVar1.id;
      (pPVar2->function_variable).id = (pPVar3->function_variable).id;
    }
    (this->super_VectorView<spirv_cross::SPIRBlock::Phi>).buffer_size =
         (other->super_VectorView<spirv_cross::SPIRBlock::Phi>).buffer_size;
  }
  return this;
}

Assistant:

SmallVector &operator=(const SmallVector &other) SPIRV_CROSS_NOEXCEPT
	{
		if (this == &other)
			return *this;

		clear();
		reserve(other.buffer_size);
		for (size_t i = 0; i < other.buffer_size; i++)
			new (&this->ptr[i]) T(other.ptr[i]);
		this->buffer_size = other.buffer_size;
		return *this;
	}